

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedGroup::~TestParsingMergeLite_RepeatedGroup
          (TestParsingMergeLite_RepeatedGroup *this)

{
  TestParsingMergeLite_RepeatedGroup *this_local;
  
  SharedDtor(&this->super_MessageLite);
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

TestParsingMergeLite_RepeatedGroup::~TestParsingMergeLite_RepeatedGroup() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMergeLite.RepeatedGroup)
  SharedDtor(*this);
}